

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O2

uint32_t __thiscall TextReader::read_uint32(TextReader *this,uint32_t min_value,uint32_t max_value)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  allocator local_142;
  allocator local_141;
  uint32_t local_140;
  uint32_t local_13c;
  ulong local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  load_next_token(this);
  if (this->current_token_type_ == ttDec) {
    local_138 = (ulong)min_value;
    uVar2 = 0;
    uVar3 = 0;
    local_140 = max_value;
    local_13c = min_value;
    while( true ) {
      if (this->current_token_len_ <= uVar2) break;
      bVar1 = (this->current_line_)._M_dataplus._M_p[uVar2 + this->current_token_pos_];
      if (9 < (byte)(bVar1 - 0x30)) {
        __assert_fail("_is_digit(current_line_[current_token_pos_ + index])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/io/textreader.hpp"
                      ,0x170,"uint32_t TextReader::read_uint32(const uint32_t, const uint32_t)");
      }
      uVar3 = (uVar3 * 10 + (ulong)bVar1) - 0x30;
      if (uVar3 < local_138 || max_value < uVar3) {
        std::__cxx11::string::string
                  ((string *)&local_f0,"The unsigned int 32 bit value is out of bounds: ",&local_141
                  );
        std::__cxx11::to_string(&local_70,local_13c);
        std::operator+(&local_d0,&local_f0,&local_70);
        std::__cxx11::string::string((string *)&local_90,"..",&local_142);
        std::operator+(&local_130,&local_d0,&local_90);
        std::__cxx11::to_string(&local_b0,local_140);
        std::operator+(&local_50,&local_130,&local_b0);
        parse_error(this,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_f0);
      }
      uVar2 = uVar2 + 1;
    }
    this->current_token_pos_ = this->current_token_pos_ + this->current_token_len_;
    this->current_token_len_ = 0;
    this->current_token_type_ = ttUnknown;
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_110,"Expect an unsigned int 32 bit value",(allocator *)&local_130);
    parse_error(this,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    uVar3 = 0;
  }
  return (uint32_t)uVar3;
}

Assistant:

inline uint32_t read_uint32(const uint32_t min_value = 0, const uint32_t max_value = UINT32_MAX) {
        load_next_token();
        if (current_token_type_ == ttDec) {
            uint64_t result = 0;
            auto index = 0;
            while (index < current_token_len_) {
                // this is checked when parsing the token already
                assert(_is_digit(current_line_[current_token_pos_ + index]));
                result = result * 10 + (current_line_[current_token_pos_ + index] - '0');
                if (result < min_value || result > max_value) {
                    parse_error(std::string("The unsigned int 32 bit value is out of bounds: ") +
                                std::to_string(min_value) + std::string("..") + std::to_string(max_value));
                };
                index++;
            };
            skip_token();
            return (uint32_t)result;
        };
        parse_error("Expect an unsigned int 32 bit value");
        return 0;
    }